

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

int __thiscall cmsys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  size_t __n;
  byte *p;
  byte bVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  byte *__s2;
  
  __s2 = (byte *)this->reginput;
  pbVar2 = (byte *)this->regbol;
switchD_00482c68_caseD_7:
  p = (byte *)prog;
  if (p == (byte *)0x0) {
    pcVar6 = "RegularExpression::find(): Internal error -- corrupted pointers.";
    goto LAB_00482d51;
  }
  prog = regnext((char *)p);
  bVar1 = *p;
  uVar8 = (ulong)bVar1;
  switch(uVar8) {
  case 0:
    goto LAB_00482e1d;
  case 1:
    if (__s2 != pbVar2) {
      return 0;
    }
    goto switchD_00482c68_caseD_7;
  case 2:
    if (*__s2 != 0) {
      return 0;
    }
    goto switchD_00482c68_caseD_7;
  case 3:
    if (*__s2 == 0) {
      return 0;
    }
    __s2 = __s2 + 1;
    this->reginput = (char *)__s2;
    goto switchD_00482c68_caseD_7;
  case 4:
    if (*__s2 == 0) {
      return 0;
    }
    pcVar6 = strchr((char *)(p + 3),(int)(char)*__s2);
    if (pcVar6 == (char *)0x0) {
      return 0;
    }
    break;
  case 5:
    if (*__s2 == 0) {
      return 0;
    }
    pcVar6 = strchr((char *)(p + 3),(int)(char)*__s2);
    if (pcVar6 != (char *)0x0) {
      return 0;
    }
    break;
  case 6:
    if (*prog == 6) {
      pcVar6 = this->reginput;
      do {
        iVar4 = regmatch(this,(char *)(p + 3));
        if (iVar4 != 0) {
          return 1;
        }
        this->reginput = pcVar6;
        p = (byte *)regnext((char *)p);
      } while ((p != (byte *)0x0) && (*p == 6));
      return 0;
    }
    prog = (char *)(p + 3);
  case 7:
  case 9:
    goto switchD_00482c68_caseD_7;
  case 8:
    if (p[3] != *__s2) {
      return 0;
    }
    __n = strlen((char *)(p + 3));
    if ((1 < __n) && (iVar4 = strncmp((char *)(p + 3),(char *)__s2,__n), iVar4 != 0)) {
      return 0;
    }
    __s2 = __s2 + __n;
    goto LAB_00482d3c;
  case 10:
  case 0xb:
    bVar5 = 0;
    if (*prog == 8) {
      bVar5 = ((byte *)prog)[3];
    }
    pcVar6 = this->reginput;
    iVar4 = regrepeat(this,(char *)(p + 3));
    lVar7 = (long)iVar4;
    while( true ) {
      if (lVar7 < (long)(ulong)(bVar1 != 10)) {
        return 0;
      }
      if (((bVar5 == 0) || (bVar5 == *this->reginput)) && (iVar4 = regmatch(this,prog), iVar4 != 0))
      break;
      lVar3 = lVar7 + -1;
      lVar7 = lVar7 + -1;
      this->reginput = pcVar6 + lVar3;
    }
    return 1;
  default:
    pcVar6 = "RegularExpression::find(): Internal error -- memory corrupted.";
LAB_00482d51:
    puts(pcVar6);
    return 0;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    pcVar6 = this->reginput;
    iVar4 = regmatch(this,prog);
    if (iVar4 == 0) {
      return 0;
    }
    if (this->regstartp[uVar8 - 0x14] == (char *)0x0) {
      this->regstartp[uVar8 - 0x14] = pcVar6;
      return 1;
    }
    return 1;
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    pcVar6 = this->reginput;
    iVar4 = regmatch(this,prog);
    if (iVar4 == 0) {
      return 0;
    }
    if (this->regendp[uVar8 - 0x1e] == (char *)0x0) {
      this->regendp[uVar8 - 0x1e] = pcVar6;
    }
    goto LAB_00482e1d;
  }
  __s2 = __s2 + 1;
LAB_00482d3c:
  this->reginput = (char *)__s2;
  goto switchD_00482c68_caseD_7;
LAB_00482e1d:
  return 1;
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != nullptr) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == nullptr)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != nullptr)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == nullptr)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == nullptr)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != nullptr && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}